

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

int64_t __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,int con)

{
  int iVar1;
  ostream *poVar2;
  
  if (-1 < con) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (con < iVar1) {
      return (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)con];
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "virtual int64_t TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex(int) const [TSHAPE = pzshape::TPZShapeQuad]"
                          );
  poVar2 = std::operator<<(poVar2," wrong parameter connect ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,con);
  poVar2 = std::operator<<(poVar2," NConnects ");
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,0xcf);
}

Assistant:

int64_t TPZCompElHCurl<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
    if(con <0 || con >= this->NConnects()) {
        std::cout <<__PRETTY_FUNCTION__ <<" wrong parameter connect " << con <<
                  " NConnects " << this-> NConnects() << std::endl;
        DebugStop();
        return -1;
    }

#endif
    return this->fConnectIndexes[con];
}